

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferDetail.hh
# Opt level: O3

void __thiscall avro::detail::BufferImpl::append(BufferImpl *this,BufferImpl *src)

{
  _Deque_iterator<avro::detail::Chunk,_const_avro::detail::Chunk_&,_const_avro::detail::Chunk_*>
  local_58;
  _Deque_iterator<avro::detail::Chunk,_const_avro::detail::Chunk_&,_const_avro::detail::Chunk_*>
  local_38;
  
  local_38._M_cur =
       (src->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_38._M_first =
       (src->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_38._M_last =
       (src->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_38._M_node =
       (src->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_58._M_cur =
       (src->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_finish._M_cur;
  local_58._M_first =
       (src->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_finish._M_first;
  local_58._M_last =
       (src->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_finish._M_last;
  local_58._M_node =
       (src->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_finish._M_node;
  std::
  __copy_move_dit<false,avro::detail::Chunk,avro::detail::Chunk_const&,avro::detail::Chunk_const*,std::back_insert_iterator<std::deque<avro::detail::Chunk,std::allocator<avro::detail::Chunk>>>>
            (&local_38,&local_58,
             (back_insert_iterator<std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>_>
              )this);
  this->size_ = this->size_ + src->size_;
  return;
}

Assistant:

void append(const BufferImpl &src) {
        std::copy(src.readChunks_.begin(), src.readChunks_.end(), std::back_inserter(readChunks_));
        size_ += src.size_;
    }